

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleTests.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::anon_unknown_0::AlphaToOneInstance::AlphaToOneInstance
          (AlphaToOneInstance *this,Context *context,VkPrimitiveTopology topology,
          vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *vertices,
          VkPipelineMultisampleStateCreateInfo *multisampleStateParams,
          VkPipelineColorBlendAttachmentState *blendState)

{
  void *pvVar1;
  VkBool32 VVar2;
  VkBool32 VVar3;
  VkPipelineMultisampleStateCreateFlags VVar4;
  VkSampleCountFlagBits VVar5;
  VkBool32 VVar6;
  float fVar7;
  VkStructureType VVar8;
  undefined4 uVar9;
  VkBlendFactor VVar10;
  VkBlendOp VVar11;
  VkColorComponentFlags VVar12;
  VkBlendFactor VVar13;
  VkBlendFactor VVar14;
  VkBlendOp VVar15;
  InstanceInterface *pIVar16;
  VkPhysicalDevice pVVar17;
  NotSupportedError *this_00;
  allocator<char> local_141;
  string local_140;
  undefined1 local_120 [8];
  VkPhysicalDeviceFeatures deviceFeatures;
  VkPipelineColorBlendAttachmentState *blendState_local;
  VkPipelineMultisampleStateCreateInfo *multisampleStateParams_local;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *vertices_local;
  VkPrimitiveTopology topology_local;
  Context *context_local;
  AlphaToOneInstance *this_local;
  
  TestInstance::TestInstance(&this->super_TestInstance,context);
  (this->super_TestInstance)._vptr_TestInstance = (_func_int **)&PTR__AlphaToOneInstance_016a4cd0;
  this->m_colorFormat = VK_FORMAT_R8G8B8A8_UNORM;
  tcu::Vector<int,_2>::Vector(&this->m_renderSize,0x20,0x20);
  this->m_primitiveTopology = topology;
  std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::vector
            (&this->m_vertices,vertices);
  VVar8 = multisampleStateParams->sType;
  uVar9 = *(undefined4 *)&multisampleStateParams->field_0x4;
  pvVar1 = multisampleStateParams->pNext;
  VVar4 = multisampleStateParams->flags;
  VVar5 = multisampleStateParams->rasterizationSamples;
  VVar6 = multisampleStateParams->sampleShadingEnable;
  fVar7 = multisampleStateParams->minSampleShading;
  VVar2 = multisampleStateParams->alphaToCoverageEnable;
  VVar3 = multisampleStateParams->alphaToOneEnable;
  (this->m_multisampleStateParams).pSampleMask = multisampleStateParams->pSampleMask;
  (this->m_multisampleStateParams).alphaToCoverageEnable = VVar2;
  (this->m_multisampleStateParams).alphaToOneEnable = VVar3;
  (this->m_multisampleStateParams).flags = VVar4;
  (this->m_multisampleStateParams).rasterizationSamples = VVar5;
  (this->m_multisampleStateParams).sampleShadingEnable = VVar6;
  (this->m_multisampleStateParams).minSampleShading = fVar7;
  (this->m_multisampleStateParams).sType = VVar8;
  *(undefined4 *)&(this->m_multisampleStateParams).field_0x4 = uVar9;
  (this->m_multisampleStateParams).pNext = pvVar1;
  VVar2 = blendState->blendEnable;
  VVar13 = blendState->srcColorBlendFactor;
  VVar14 = blendState->dstColorBlendFactor;
  VVar15 = blendState->colorBlendOp;
  VVar10 = blendState->dstAlphaBlendFactor;
  VVar11 = blendState->alphaBlendOp;
  VVar12 = blendState->colorWriteMask;
  (this->m_colorBlendState).srcAlphaBlendFactor = blendState->srcAlphaBlendFactor;
  (this->m_colorBlendState).dstAlphaBlendFactor = VVar10;
  (this->m_colorBlendState).alphaBlendOp = VVar11;
  (this->m_colorBlendState).colorWriteMask = VVar12;
  (this->m_colorBlendState).blendEnable = VVar2;
  (this->m_colorBlendState).srcColorBlendFactor = VVar13;
  (this->m_colorBlendState).dstColorBlendFactor = VVar14;
  (this->m_colorBlendState).colorBlendOp = VVar15;
  pIVar16 = Context::getInstanceInterface(context);
  pVVar17 = Context::getPhysicalDevice(context);
  (*pIVar16->_vptr_InstanceInterface[2])(pIVar16,pVVar17,local_120);
  if (deviceFeatures.wideLines == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_140,"Alpha-to-one is not supported",&local_141);
    tcu::NotSupportedError::NotSupportedError(this_00,&local_140);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  return;
}

Assistant:

AlphaToOneInstance::AlphaToOneInstance (Context&									context,
										VkPrimitiveTopology							topology,
										const std::vector<Vertex4RGBA>&				vertices,
										const VkPipelineMultisampleStateCreateInfo&	multisampleStateParams,
										const VkPipelineColorBlendAttachmentState&	blendState)
	: vkt::TestInstance			(context)
	, m_colorFormat				(VK_FORMAT_R8G8B8A8_UNORM)
	, m_renderSize				(32, 32)
	, m_primitiveTopology		(topology)
	, m_vertices				(vertices)
	, m_multisampleStateParams	(multisampleStateParams)
	, m_colorBlendState			(blendState)
{
	VkPhysicalDeviceFeatures deviceFeatures;

	context.getInstanceInterface().getPhysicalDeviceFeatures(context.getPhysicalDevice(), &deviceFeatures);

	if (!deviceFeatures.alphaToOne)
		throw tcu::NotSupportedError("Alpha-to-one is not supported");
}